

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

void strescape(char *s,char c)

{
  bool bVar1;
  char *pcStack_28;
  _Bool escapenext;
  char *out;
  char *in;
  char c_local;
  char *s_local;
  
  bVar1 = false;
  pcStack_28 = s;
  for (out = s; *out != '\0'; out = out + 1) {
    if ((*out != c) || (bVar1)) {
      *pcStack_28 = *out;
      pcStack_28 = pcStack_28 + 1;
      bVar1 = false;
    }
    else if (*out == c) {
      bVar1 = true;
    }
  }
  *pcStack_28 = '\0';
  return;
}

Assistant:

void strescape(char *s, const char c) {
	char *in = s;
	char *out = s;
	bool escapenext = false;
	while (*in) {
		if (*in != c || escapenext) {
			*out = *in;
			out++;
			escapenext = false;
		} else if (*in == c) {
			escapenext = true;
		}
		in++;
	}
	*out = 0;
}